

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<Fad<Fad<double>_>,_3>::Resize
          (TPZManVector<Fad<Fad<double>_>,_3> *this,int64_t newsize,Fad<Fad<double>_> *object)

{
  Fad<Fad<double>_> *pFVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  Fad<Fad<double>_> *pFVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  
  if (-1 < newsize) {
    lVar12 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
    if (lVar12 != newsize) {
      lVar8 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc;
      if (lVar8 < newsize) {
        if ((ulong)newsize < 4) {
          pFVar1 = this->fExtAlloc;
          lVar10 = 0;
          for (lVar8 = 0; lVar8 < lVar12; lVar8 = lVar8 + 1) {
            Fad<Fad<double>_>::operator=
                      ((Fad<Fad<double>_> *)(&pFVar1->field_0x0 + lVar10),
                       (Fad<Fad<double>_> *)
                       (&((this->super_TPZVec<Fad<Fad<double>_>_>).fStore)->field_0x0 + lVar10));
            lVar12 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
            lVar10 = lVar10 + 0x58;
          }
          lVar12 = lVar8;
          if (lVar8 < newsize) {
            lVar12 = newsize;
          }
          pFVar9 = (Fad<Fad<double>_> *)(&pFVar1->field_0x0 + lVar10);
          for (; lVar8 != lVar12; lVar12 = lVar12 + -1) {
            Fad<Fad<double>_>::operator=(pFVar9,object);
            pFVar9 = pFVar9 + 1;
          }
          pFVar9 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
          if (pFVar9 != (Fad<Fad<double>_> *)0x0 && pFVar9 != pFVar1) {
            dVar13 = pFVar9[-1].defaultVal.defaultVal;
            if (dVar13 != 0.0) {
              lVar12 = (long)dVar13 * 0x58;
              do {
                Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)(&pFVar9[-1].field_0x0 + lVar12));
                lVar12 = lVar12 + -0x58;
              } while (lVar12 != 0);
            }
            operator_delete__(&pFVar9[-1].defaultVal.defaultVal,(long)dVar13 * 0x58 + 8);
          }
          (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = pFVar1;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = 3;
        }
        else {
          dVar13 = (double)lVar8 * 1.2;
          uVar11 = (long)dVar13;
          if (dVar13 < (double)newsize) {
            uVar11 = newsize;
          }
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar11;
          uVar5 = SUB168(auVar3 * ZEXT816(0x58),0);
          uVar6 = uVar5 + 8;
          if (0xfffffffffffffff7 < uVar5) {
            uVar6 = 0xffffffffffffffff;
          }
          uVar5 = 0xffffffffffffffff;
          if (SUB168(auVar3 * ZEXT816(0x58),8) == 0) {
            uVar5 = uVar6;
          }
          puVar7 = (ulong *)operator_new__(uVar5);
          *puVar7 = uVar11;
          if (uVar11 != 0) {
            lVar8 = 0;
            do {
              *(undefined8 *)((long)puVar7 + lVar8 + 0x10) = 0;
              *(undefined4 *)((long)puVar7 + lVar8 + 0x18) = 0;
              puVar2 = (undefined8 *)((long)puVar7 + lVar8 + 0x50);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined4 *)((long)puVar7 + lVar8 + 0x30) = 0;
              puVar2 = (undefined8 *)((long)puVar7 + lVar8 + 0x20);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined4 *)((long)puVar7 + lVar8 + 0x48) = 0;
              puVar2 = (undefined8 *)((long)puVar7 + lVar8 + 0x38);
              *puVar2 = 0;
              puVar2[1] = 0;
              lVar8 = lVar8 + 0x58;
            } while (uVar11 * 0x58 - lVar8 != 0);
          }
          pFVar1 = (Fad<Fad<double>_> *)(puVar7 + 1);
          lVar8 = 0;
          for (lVar10 = 0; lVar10 < lVar12; lVar10 = lVar10 + 1) {
            Fad<Fad<double>_>::operator=
                      ((Fad<Fad<double>_> *)(&pFVar1->field_0x0 + lVar8),
                       (Fad<Fad<double>_> *)
                       (&((this->super_TPZVec<Fad<Fad<double>_>_>).fStore)->field_0x0 + lVar8));
            lVar12 = (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements;
            lVar8 = lVar8 + 0x58;
          }
          lVar12 = lVar10;
          if (lVar10 < newsize) {
            lVar12 = newsize;
          }
          pFVar9 = (Fad<Fad<double>_> *)(&pFVar1->field_0x0 + lVar8);
          for (; lVar10 != lVar12; lVar12 = lVar12 + -1) {
            Fad<Fad<double>_>::operator=(pFVar9,object);
            pFVar9 = pFVar9 + 1;
          }
          pFVar9 = (this->super_TPZVec<Fad<Fad<double>_>_>).fStore;
          if (pFVar9 != (Fad<Fad<double>_> *)0x0 && pFVar9 != this->fExtAlloc) {
            dVar13 = pFVar9[-1].defaultVal.defaultVal;
            if (dVar13 != 0.0) {
              lVar12 = (long)dVar13 * 0x58;
              do {
                Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)(&pFVar9[-1].field_0x0 + lVar12));
                lVar12 = lVar12 + -0x58;
              } while (lVar12 != 0);
            }
            operator_delete__(&pFVar9[-1].defaultVal.defaultVal,(long)dVar13 * 0x58 + 8);
          }
          (this->super_TPZVec<Fad<Fad<double>_>_>).fStore = pFVar1;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
          (this->super_TPZVec<Fad<Fad<double>_>_>).fNAlloc = uVar11;
        }
      }
      else {
        lVar8 = lVar12 * 0x58;
        for (; lVar12 < newsize; lVar12 = lVar12 + 1) {
          Fad<Fad<double>_>::operator=
                    ((Fad<Fad<double>_> *)
                     (&((this->super_TPZVec<Fad<Fad<double>_>_>).fStore)->field_0x0 + lVar8),object)
          ;
          lVar8 = lVar8 + 0x58;
        }
        (this->super_TPZVec<Fad<Fad<double>_>_>).fNElements = newsize;
      }
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}